

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

Token * __thiscall enact::Lexer::string(Token *__return_storage_ptr__,Lexer *this)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  Token *pTVar4;
  col_t cVar5;
  bool bVar6;
  string value;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  uint7 uStack_77;
  undefined8 uStack_70;
  size_type *local_68;
  undefined8 local_60;
  size_type local_58 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  string *local_40;
  undefined8 local_38;
  
  local_80 = 0;
  local_78 = 0;
  uVar3 = this->m_current;
  local_88 = &local_78;
  if (uVar3 < (this->m_source)._M_string_length) {
    local_48 = &(__return_storage_ptr__->lexeme).field_2;
    local_40 = (string *)&__return_storage_ptr__->lexeme;
    bVar6 = false;
    local_90 = 1;
    local_38 = 2;
    do {
      bVar1 = (this->m_source)._M_dataplus._M_p[uVar3];
      if (bVar6) {
        if (bVar1 < 0x6e) {
          if (bVar1 != 0x22) {
            if (bVar1 == 0x28) {
              cVar5 = (short)*(undefined4 *)&this->m_col + 1;
              this->m_col = cVar5;
              this->m_current = uVar3 + 1;
              local_68 = local_58;
              local_58[0] = (ulong)uStack_77 << 8;
              local_80 = 0;
              local_78 = 0;
              this->m_currentInterpolations = this->m_currentInterpolations + 1;
              __return_storage_ptr__->type = INTERPOLATION;
              (__return_storage_ptr__->lexeme)._M_dataplus._M_p = (pointer)local_48;
              local_48->_M_allocated_capacity = local_58[0];
              *(undefined8 *)((long)&(__return_storage_ptr__->lexeme).field_2 + 8) = uStack_70;
              (__return_storage_ptr__->lexeme)._M_string_length = 0;
              local_60 = 0;
              local_58[0] = (ulong)uStack_77 << 8;
              __return_storage_ptr__->line = this->m_line;
              __return_storage_ptr__->col = cVar5;
              goto LAB_001174f9;
            }
            if (bVar1 != 0x5c) goto LAB_0011728b;
          }
        }
        else if (((bVar1 != 0x6e) && (bVar1 != 0x72)) && (bVar1 != 0x74)) {
LAB_0011728b:
          this->m_col = this->m_col + 1;
          this->m_current = uVar3 + 1;
          local_b0 = local_a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"Unrecognised escape sequence.","");
          __return_storage_ptr__->type = ERROR;
          (__return_storage_ptr__->lexeme)._M_dataplus._M_p = (pointer)local_48;
          std::__cxx11::string::_M_construct<char*>(local_40,local_b0,local_a8 + (long)local_b0);
          __return_storage_ptr__->line = this->m_line;
          __return_storage_ptr__->col = this->m_col;
          if (local_b0 != local_a0) {
            operator_delete(local_b0,local_a0[0] + 1);
          }
          pTVar4 = (Token *)(*(code *)((long)&DAT_0011f150 + (long)(int)(&DAT_0011f150)[local_90]))
                                      ();
          return pTVar4;
        }
        std::__cxx11::string::push_back((char)&local_88);
LAB_00117361:
        this->m_col = this->m_col + 1;
        this->m_current = this->m_current + 1;
        uVar2 = 0;
LAB_0011736c:
        pTVar4 = (Token *)(*(code *)((long)&DAT_0011f150 + (long)(int)(&DAT_0011f150)[uVar2]))();
        return pTVar4;
      }
      if (bVar1 == 0x22) {
        uVar2 = 3;
        goto LAB_0011736c;
      }
      if (bVar1 != 0x5c) {
        std::__cxx11::string::push_back((char)&local_88);
        goto LAB_00117361;
      }
      this->m_col = this->m_col + 1;
      this->m_current = uVar3 + 1;
      bVar6 = true;
      uVar3 = this->m_current;
    } while (uVar3 < (this->m_source)._M_string_length);
  }
  if (this->m_current < (this->m_source)._M_string_length) {
    this->m_col = this->m_col + 1;
    this->m_current = this->m_current + 1;
    __return_storage_ptr__->type = STRING;
    (__return_storage_ptr__->lexeme)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->lexeme).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->lexeme,&local_78,&local_78);
    __return_storage_ptr__->line = this->m_line;
    __return_storage_ptr__->col = this->m_col;
  }
  else {
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Unterminated string.","");
    __return_storage_ptr__->type = ERROR;
    (__return_storage_ptr__->lexeme)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->lexeme).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->lexeme,local_b0,local_a8 + (long)local_b0);
    __return_storage_ptr__->line = this->m_line;
    __return_storage_ptr__->col = this->m_col;
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
  }
LAB_001174f9:
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::string() {
        std::string value;
        bool inEscapeSequence = false;
        while (!isAtEnd()) {
            const char c = peek();

            if (inEscapeSequence) {
                switch (c) {
                    case 'n':
                        value.push_back('\n');
                        break;
                    case 'r':
                        value.push_back('\r');
                        break;
                    case 't':
                        value.push_back('\t');
                        break;
                    case '\\':
                        value.push_back('\\');
                        break;
                    case '"':
                        value.push_back('"');
                        break;
                    case '(':
                        // Eat the '('
                        advance();
                        return interpolationStart(std::move(value));
                    default:
                        advance();
                        return errorToken("Unrecognised escape sequence.");
                }

                inEscapeSequence = false;
            } else {
                if (c == '"') break;
                if (c == '\\') {
                    inEscapeSequence = true;
                    advance();
                    continue;
                }

                value.push_back(c);
            }

            advance();
        }

        if (isAtEnd()) {
            return errorToken("Unterminated string.");
        }

        // Eat the close quote.
        advance();

        return Token{TokenType::STRING, value, m_line, m_col};
    }